

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu_matrix.c
# Opt level: O3

void GPU_MatrixLookAt(float *matrix,float eye_x,float eye_y,float eye_z,float target_x,
                     float target_y,float target_z,float up_x,float up_y,float up_z)

{
  float fVar1;
  float in_XMM1_Db;
  float fVar2;
  float in_XMM2_Db;
  float fVar3;
  float in_XMM4_Db;
  float fVar6;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  float in_XMM5_Db;
  float temp [16];
  undefined8 local_98;
  float local_90;
  undefined4 local_8c;
  float local_88;
  float local_84;
  float local_80;
  undefined4 local_7c;
  float local_78;
  float local_74;
  float local_70;
  undefined8 local_6c;
  undefined8 uStack_64;
  undefined4 local_5c;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  fVar3 = target_x - eye_x;
  auVar4._0_4_ = target_y - eye_y;
  auVar4._4_4_ = target_z - eye_z;
  auVar4._8_4_ = in_XMM4_Db - in_XMM1_Db;
  auVar4._12_4_ = in_XMM5_Db - in_XMM2_Db;
  fVar2 = SQRT(auVar4._4_4_ * auVar4._4_4_ + fVar3 * fVar3 + auVar4._0_4_ * auVar4._0_4_);
  fVar3 = fVar3 / fVar2;
  fVar1 = SQRT(up_z * up_z + up_x * up_x + up_y * up_y);
  local_90 = -fVar3;
  auVar5._4_4_ = fVar2;
  auVar5._0_4_ = fVar2;
  auVar5._8_4_ = fVar2;
  auVar5._12_4_ = fVar2;
  auVar5 = divps(auVar4,auVar5);
  fVar2 = auVar5._0_4_;
  fVar6 = auVar5._4_4_;
  local_88 = fVar6 * (up_x / fVar1) - (up_z / fVar1) * fVar3;
  local_80 = -fVar2;
  local_78 = fVar3 * (up_y / fVar1) - (up_x / fVar1) * fVar2;
  local_70 = -fVar6;
  fVar1 = (up_z / fVar1) * fVar2 - (up_y / fVar1) * fVar6;
  local_84 = local_78 * fVar3 - fVar6 * fVar1;
  local_74 = fVar2 * fVar1 - fVar3 * local_88;
  local_98 = CONCAT44(local_88 * fVar6 - fVar2 * local_78,fVar1);
  local_6c = 0;
  uStack_64 = 0;
  local_7c = 0;
  local_8c = 0;
  local_5c = 0x3f800000;
  GPU_MatrixMultiply((float *)&local_58,matrix,(float *)&local_98);
  *(undefined8 *)(matrix + 0xc) = local_28;
  *(undefined8 *)(matrix + 0xe) = uStack_20;
  *(undefined8 *)(matrix + 8) = local_38;
  *(undefined8 *)(matrix + 10) = uStack_30;
  *(undefined8 *)(matrix + 4) = local_48;
  *(undefined8 *)(matrix + 6) = uStack_40;
  *(undefined8 *)matrix = local_58;
  *(undefined8 *)(matrix + 2) = uStack_50;
  GPU_MatrixTranslate(matrix,-eye_x,-eye_y,-eye_z);
  return;
}

Assistant:

void GPU_MatrixLookAt(float* matrix, float eye_x, float eye_y, float eye_z, float target_x, float target_y, float target_z, float up_x, float up_y, float up_z)
{
	float forward[3] = {target_x - eye_x, target_y - eye_y, target_z - eye_z};
	float up[3] = {up_x, up_y, up_z};
	float side[3];
	float view[16];

	GPU_VectorNormalize(forward);
	GPU_VectorNormalize(up);

	// Calculate sideways vector
	GPU_VectorCross(side, forward, up);

	// Calculate new up vector
	GPU_VectorCross(up, side, forward);

	// Set up view matrix
	view[0] = side[0];
	view[4] = side[1];
	view[8] = side[2];
	view[12] = 0.0f;

	view[1] = up[0];
	view[5] = up[1];
	view[9] = up[2];
	view[13] = 0.0f;

	view[2] = -forward[0];
	view[6] = -forward[1];
	view[10] = -forward[2];
	view[14] = 0.0f;

	view[3] = view[7] = view[11] = 0.0f;
	view[15] = 1.0f;

	GPU_MultiplyAndAssign(matrix, view);
	GPU_MatrixTranslate(matrix, -eye_x, -eye_y, -eye_z);
}